

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

word Abc_Tt6Stretch(word t,int nVars)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x489,"word Abc_Tt6Stretch(word, int)");
  }
  iVar1 = 2;
  if (2U < (uint)nVars) {
    iVar1 = nVars;
  }
  iVar4 = 3;
  if (2U < (uint)nVars) {
    iVar4 = iVar1;
  }
  iVar1 = 4;
  if (iVar4 != 3) {
    iVar1 = iVar4;
  }
  iVar3 = 5;
  if (iVar1 != 4) {
    iVar3 = iVar1;
  }
  if (iVar3 - 5U < 2) {
    uVar6 = (uint)t;
    uVar7 = -(uVar6 & 1);
    if (nVars != 0) {
      uVar7 = uVar6;
    }
    uVar7 = (uVar7 & 3) * 5;
    if (1 < (uint)nVars) {
      uVar7 = uVar6;
    }
    uVar5 = (ulong)((uVar7 & 0xf) << 4 | uVar7 & 0xf);
    if (2 < (uint)nVars) {
      uVar5 = t;
    }
    uVar2 = (ulong)(uint)((int)(uVar5 & 0xff) << 8) | uVar5 & 0xff;
    if (iVar4 != 3) {
      uVar2 = uVar5;
    }
    uVar5 = (ulong)(uint)((int)uVar2 << 0x10) | uVar2 & 0xffff;
    if (iVar1 != 4) {
      uVar5 = uVar2;
    }
    uVar2 = uVar5 << 0x20 | uVar5 & 0xffffffff;
    if (iVar3 != 5) {
      uVar2 = uVar5;
    }
    return uVar2;
  }
  __assert_fail("nVars == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x496,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

static inline word Abc_Tt6Stretch( word t, int nVars )
{
    assert( nVars >= 0 );
    if ( nVars == 0 )
        nVars++, t = (t & 0x1) | ((t & 0x1) << 1);
    if ( nVars == 1 )
        nVars++, t = (t & 0x3) | ((t & 0x3) << 2);
    if ( nVars == 2 )
        nVars++, t = (t & 0xF) | ((t & 0xF) << 4);
    if ( nVars == 3 )
        nVars++, t = (t & 0xFF) | ((t & 0xFF) << 8);
    if ( nVars == 4 )
        nVars++, t = (t & 0xFFFF) | ((t & 0xFFFF) << 16);
    if ( nVars == 5 )
        nVars++, t = (t & 0xFFFFFFFF) | ((t & 0xFFFFFFFF) << 32);
    assert( nVars == 6 );
    return t;
}